

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswIslands.c
# Opt level: O0

Vec_Int_t * Ssw_MatchingMiter(Aig_Man_t *pMiter,Aig_Man_t *p0,Aig_Man_t *p1,Vec_Int_t *vPairsAll)

{
  int iVar1;
  Aig_Type_t AVar2;
  Aig_Type_t AVar3;
  Vec_Int_t *p;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_44;
  int i;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Vec_Int_t *vPairsMiter;
  Vec_Int_t *vPairsAll_local;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  Aig_Man_t *pMiter_local;
  
  iVar1 = Aig_ManObjNum(p0);
  p = Vec_IntAlloc(iVar1 << 1);
  local_44 = 0;
  do {
    iVar1 = Vec_IntSize(vPairsAll);
    if (iVar1 <= local_44) {
      return p;
    }
    iVar1 = Vec_IntEntry(vPairsAll,local_44);
    pAVar4 = Aig_ManObj(p0,iVar1);
    iVar1 = Vec_IntEntry(vPairsAll,local_44 + 1);
    pAVar5 = Aig_ManObj(p1,iVar1);
    if ((pAVar4->field_5).pData == (void *)0x0) {
      __assert_fail("pObj0->pData != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                    ,0x17d,
                    "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                   );
    }
    if ((pAVar5->field_5).pData == (void *)0x0) {
      __assert_fail("pObj1->pData != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                    ,0x17e,
                    "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                   );
    }
    if ((((pAVar4->field_5).pData != (pAVar5->field_5).pData) &&
        (iVar1 = Aig_ObjIsNone((Aig_Obj_t *)(pAVar4->field_5).pData), iVar1 == 0)) &&
       (iVar1 = Aig_ObjIsNone((Aig_Obj_t *)(pAVar5->field_5).pData), iVar1 == 0)) {
      pAVar4 = (Aig_Obj_t *)(pAVar4->field_5).pData;
      pAVar5 = (Aig_Obj_t *)(pAVar5->field_5).pData;
      iVar1 = Aig_IsComplement(pAVar4);
      if (iVar1 != 0) {
        __assert_fail("!Aig_IsComplement(pObj0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                      ,0x186,
                      "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                     );
      }
      iVar1 = Aig_IsComplement(pAVar5);
      if (iVar1 != 0) {
        __assert_fail("!Aig_IsComplement(pObj1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                      ,0x187,
                      "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                     );
      }
      AVar2 = Aig_ObjType(pAVar4);
      AVar3 = Aig_ObjType(pAVar5);
      if (AVar2 != AVar3) {
        __assert_fail("Aig_ObjType(pObj0) == Aig_ObjType(pObj1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                      ,0x188,
                      "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                     );
      }
      iVar1 = Aig_ObjIsCo(pAVar4);
      if (iVar1 == 0) {
        iVar1 = Aig_ObjIsNode(pAVar4);
        if ((iVar1 == 0) && (iVar1 = Saig_ObjIsLo(pMiter,pAVar4), iVar1 == 0)) {
          __assert_fail("Aig_ObjIsNode(pObj0) || Saig_ObjIsLo(pMiter, pObj0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                        ,0x18b,
                        "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                       );
        }
        iVar1 = Aig_ObjIsNode(pAVar5);
        if ((iVar1 == 0) && (iVar1 = Saig_ObjIsLo(pMiter,pAVar5), iVar1 == 0)) {
          __assert_fail("Aig_ObjIsNode(pObj1) || Saig_ObjIsLo(pMiter, pObj1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                        ,0x18c,
                        "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                       );
        }
        if (pAVar5->Id <= pAVar4->Id) {
          __assert_fail("pObj0->Id < pObj1->Id",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswIslands.c"
                        ,0x18d,
                        "Vec_Int_t *Ssw_MatchingMiter(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Int_t *)"
                       );
        }
        Vec_IntPush(p,pAVar4->Id);
        Vec_IntPush(p,pAVar5->Id);
      }
    }
    local_44 = local_44 + 2;
  } while( true );
}

Assistant:

Vec_Int_t * Ssw_MatchingMiter( Aig_Man_t * pMiter, Aig_Man_t * p0, Aig_Man_t * p1, Vec_Int_t * vPairsAll )
{
    Vec_Int_t * vPairsMiter;
    Aig_Obj_t * pObj0, * pObj1;
    int i;
    // create matching of nodes in the miter
    vPairsMiter = Vec_IntAlloc( 2*Aig_ManObjNum(p0) );
    for ( i = 0; i < Vec_IntSize(vPairsAll); i += 2 )
    {
        pObj0 = Aig_ManObj( p0, Vec_IntEntry(vPairsAll, i) );
        pObj1 = Aig_ManObj( p1, Vec_IntEntry(vPairsAll, i+1) );
        assert( pObj0->pData != NULL );
        assert( pObj1->pData != NULL );
        if ( pObj0->pData == pObj1->pData )
            continue;
        if ( Aig_ObjIsNone((Aig_Obj_t *)pObj0->pData) || Aig_ObjIsNone((Aig_Obj_t *)pObj1->pData) )
            continue;
        // get the miter nodes
        pObj0 = (Aig_Obj_t *)pObj0->pData;
        pObj1 = (Aig_Obj_t *)pObj1->pData;
        assert( !Aig_IsComplement(pObj0) );
        assert( !Aig_IsComplement(pObj1) );
        assert( Aig_ObjType(pObj0) == Aig_ObjType(pObj1) );
        if ( Aig_ObjIsCo(pObj0) )
            continue;
        assert( Aig_ObjIsNode(pObj0) || Saig_ObjIsLo(pMiter, pObj0) );
        assert( Aig_ObjIsNode(pObj1) || Saig_ObjIsLo(pMiter, pObj1) );
        assert( pObj0->Id < pObj1->Id );
        Vec_IntPush( vPairsMiter, pObj0->Id );
        Vec_IntPush( vPairsMiter, pObj1->Id );
    }
    return vPairsMiter;
}